

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CastExpression::Deserialize(CastExpression *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  CastExpression *this_00;
  pointer pCVar4;
  byte bVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true> result;
  _Head_base<0UL,_duckdb::CastExpression_*,_false> local_38;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  
  this_00 = (CastExpression *)operator_new(0x60);
  CastExpression(this_00);
  local_38._M_head_impl = this_00;
  pCVar4 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_38);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child");
  bVar5 = (byte)iVar2;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pCVar4->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar4->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var6._M_head_impl == (ParsedExpression *)0x0) {
      bVar5 = 0;
      goto LAB_010b7e4e;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      local_30._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pCVar4->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar4->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var6._M_head_impl == (ParsedExpression *)0x0) {
      bVar5 = 1;
      goto LAB_010b7e4e;
    }
  }
  (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010b7e4e:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pCVar4 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_38);
  Deserializer::ReadProperty<duckdb::LogicalType>(deserializer,0xc9,"cast_type",&pCVar4->cast_type);
  pCVar4 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_38);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"try_cast");
  if ((char)uVar3 == '\0') {
    uVar1 = false;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar2;
  }
  pCVar4->try_cast = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CastExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CastExpression>(new CastExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadProperty<LogicalType>(201, "cast_type", result->cast_type);
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}